

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O0

QDataStream * operator<<(QDataStream *out,QRegularExpression *re)

{
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  quint32 in_stack_ffffffffffffff8c;
  QDataStream *in_stack_ffffffffffffff90;
  QRegularExpression *in_stack_ffffffffffffff98;
  QFlagsStorageHelper<QRegularExpression::PatternOption,_4> local_24 [5];
  QString *in_stack_fffffffffffffff0;
  QDataStream *out_00;
  
  out_00 = *(QDataStream **)(in_FS_OFFSET + 0x28);
  QRegularExpression::pattern(in_stack_ffffffffffffff98);
  operator<<(out_00,in_stack_fffffffffffffff0);
  local_24[0].super_QFlagsStorage<QRegularExpression::PatternOption>.i =
       (QFlagsStorage<QRegularExpression::PatternOption>)
       QRegularExpression::patternOptions((QRegularExpression *)in_stack_ffffffffffffff90);
  QFlags<QRegularExpression::PatternOption>::toInt
            ((QFlags<QRegularExpression::PatternOption> *)local_24);
  QDataStream::operator<<(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  QString::~QString((QString *)0x7311c4);
  if (*(QDataStream **)(in_FS_OFFSET + 0x28) == out_00) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator<<(QDataStream &out, const QRegularExpression &re)
{
    out << re.pattern() << quint32(re.patternOptions().toInt());
    return out;
}